

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

TryEmplaceResult * __thiscall
QHash<int,QEvdevTouchScreenHandlerThread::FilteredTouchPoint>::tryEmplace_impl<int_const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,int *key)

{
  uchar uVar1;
  Span *pSVar2;
  Bucket BVar3;
  long lVar4;
  size_t hash;
  Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_> *pDVar5;
  Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> *n;
  long in_FS_OFFSET;
  Bucket BVar6;
  Bucket local_50;
  QHash<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *this;
  if (lVar4 == 0) {
    QHash<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>::detach
              ((QHash<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> *)this);
    lVar4 = *this;
  }
  local_40.d = (Data *)0x0;
  hash = QHashPrivate::calculateHash<int>(key,*(size_t *)(lVar4 + 0x18));
  BVar6 = QHashPrivate::
          Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::
          findBucketWithHash<int>(*this,key,hash);
  uVar1 = (BVar6.span)->offsets[BVar6.index];
  pDVar5 = *this;
  local_50 = BVar6;
  if ((pDVar5 == (Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>
                  *)0x0) || (1 < (uint)(pDVar5->ref).atomic._q_value.super___atomic_base<int>)) {
LAB_0012f315:
    QHash<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>::operator=
              (&local_40,(QHash<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint> *)this);
    pDVar5 = *this;
    if ((uVar1 == 0xff) && (pDVar5->numBuckets >> 1 <= pDVar5->size)) {
      pDVar5 = QHashPrivate::
               Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::
               detached(pDVar5,pDVar5->size + 1);
      *(Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_> **)this =
           pDVar5;
      local_50 = QHashPrivate::
                 Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>
                 ::findBucketWithHash<int>(pDVar5,key,hash);
    }
    else {
      pSVar2 = pDVar5->spans;
      pDVar5 = QHashPrivate::
               Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::
               detached(pDVar5);
      *(Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_> **)this =
           pDVar5;
      local_50.index._0_4_ = (uint)BVar6.index & 0x7f;
      BVar3.index._0_4_ = (uint)local_50.index;
      BVar3.span = pDVar5->spans +
                   ((((long)BVar6.span - (long)pSVar2) / 0x90 << 7 | BVar6.index) >> 7);
      BVar3.index._4_4_ = 0;
      local_50.span =
           pDVar5->spans + ((((long)BVar6.span - (long)pSVar2) / 0x90 << 7 | BVar6.index) >> 7);
      local_50.index._4_4_ = 0;
      if (uVar1 != 0xff) {
        pDVar5 = *this;
        BVar6 = BVar3;
        goto LAB_0012f3d7;
      }
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_0012f3d7;
    if (pDVar5->numBuckets >> 1 <= pDVar5->size) goto LAB_0012f315;
  }
  n = QHashPrivate::
      Data<QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>_>::Bucket::
      insert(&local_50);
  QHashPrivate::Node<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>::createInPlace<>
            (n,key);
  pDVar5 = *this;
  pDVar5->size = pDVar5->size + 1;
  BVar6 = local_50;
LAB_0012f3d7:
  pSVar2 = pDVar5->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar5;
  (__return_storage_ptr__->iterator).i.bucket =
       ((long)BVar6.span - (long)pSVar2) / 0x90 << 7 | BVar6.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<int,_QEvdevTouchScreenHandlerThread::FilteredTouchPoint>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }